

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O0

JoypadButtons * joypad_unpack_buttons(JoypadButtons *__return_storage_ptr__,u8 packed)

{
  u8 packed_local;
  
  __return_storage_ptr__->A = packed & TRUE;
  __return_storage_ptr__->B = (int)(uint)packed >> 1 & TRUE;
  __return_storage_ptr__->select = (int)(uint)packed >> 2 & TRUE;
  __return_storage_ptr__->start = (int)(uint)packed >> 3 & TRUE;
  __return_storage_ptr__->right = (int)(uint)packed >> 4 & TRUE;
  __return_storage_ptr__->left = (int)(uint)packed >> 5 & TRUE;
  __return_storage_ptr__->up = (int)(uint)packed >> 6 & TRUE;
  __return_storage_ptr__->down = (int)(uint)packed >> 7;
  return __return_storage_ptr__;
}

Assistant:

JoypadButtons joypad_unpack_buttons(u8 packed) {
  JoypadButtons buttons;
  buttons.A = packed & 1;
  buttons.B = (packed >> 1) & 1;
  buttons.select = (packed >> 2) & 1;
  buttons.start = (packed >> 3) & 1;
  buttons.right = (packed >> 4) & 1;
  buttons.left = (packed >> 5) & 1;
  buttons.up = (packed >> 6) & 1;
  buttons.down = (packed >> 7) & 1;
  return buttons;
}